

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
* __thiscall
nlohmann::detail::
iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::operator+=(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *this,difference_type i)

{
  primitive_iterator_t *ppVar1;
  iterator *piVar2;
  value_t vVar3;
  invalid_iterator *__return_storage_ptr__;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_R8;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  vVar3 = this->m_object->m_type;
  if (vVar3 == array) {
    piVar2 = &(this->m_it).array_iterator;
    piVar2->_M_current = piVar2->_M_current + i;
  }
  else {
    if (vVar3 == object) {
      __return_storage_ptr__ = (invalid_iterator *)__cxa_allocate_exception(0x20);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"cannot use offsets with object iterators","");
      invalid_iterator::
      create<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (__return_storage_ptr__,(invalid_iterator *)0xd1,(int)local_40,
                 (string *)this->m_object,in_R8);
      __cxa_throw(__return_storage_ptr__,&invalid_iterator::typeinfo,exception::~exception);
    }
    ppVar1 = &(this->m_it).primitive_iterator;
    ppVar1->m_it = ppVar1->m_it + i;
  }
  return this;
}

Assistant:

iter_impl& operator+=(difference_type i)
    {
        JSON_ASSERT(m_object != nullptr);

        switch (m_object->m_type)
        {
            case value_t::object:
                JSON_THROW(invalid_iterator::create(209, "cannot use offsets with object iterators", *m_object));

            case value_t::array:
            {
                std::advance(m_it.array_iterator, i);
                break;
            }

            case value_t::null:
            case value_t::string:
            case value_t::boolean:
            case value_t::number_integer:
            case value_t::number_unsigned:
            case value_t::number_float:
            case value_t::binary:
            case value_t::discarded:
            default:
            {
                m_it.primitive_iterator += i;
                break;
            }
        }

        return *this;
    }